

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenu::keyPressEvent(QMenu *this,QKeyEvent *e)

{
  Int IVar1;
  QPoint p;
  QPoint p_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  QFlagsStorage<Qt::KeyboardModifier> rhs;
  int iVar7;
  QMenuPrivate *pQVar8;
  QMenuBar *pQVar9;
  QStyle *pQVar10;
  QString *this_00;
  qsizetype qVar11;
  const_reference ppQVar12;
  ulong uVar13;
  char16_t *pcVar14;
  QMenu *pQVar15;
  QObject *pQVar16;
  QMenuPrivate *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *extraout_RDX_04;
  sockaddr *extraout_RDX_05;
  sockaddr *extraout_RDX_06;
  sockaddr *extraout_RDX_07;
  sockaddr *extraout_RDX_08;
  sockaddr *extraout_RDX_09;
  sockaddr *extraout_RDX_10;
  sockaddr *extraout_RDX_11;
  sockaddr *extraout_RDX_12;
  sockaddr *extraout_RDX_13;
  sockaddr *extraout_RDX_14;
  sockaddr *extraout_RDX_15;
  sockaddr *psVar17;
  sockaddr *extraout_RDX_16;
  sockaddr *extraout_RDX_17;
  sockaddr *extraout_RDX_18;
  sockaddr *extraout_RDX_19;
  sockaddr *extraout_RDX_20;
  sockaddr *extraout_RDX_21;
  sockaddr *extraout_RDX_22;
  sockaddr *extraout_RDX_23;
  sockaddr *extraout_RDX_24;
  sockaddr *extraout_RDX_25;
  sockaddr *extraout_RDX_26;
  sockaddr *extraout_RDX_27;
  sockaddr *extraout_RDX_28;
  sockaddr *extraout_RDX_29;
  sockaddr *extraout_RDX_30;
  sockaddr *extraout_RDX_31;
  sockaddr *extraout_RDX_32;
  sockaddr *extraout_RDX_33;
  sockaddr *extraout_RDX_34;
  sockaddr *extraout_RDX_35;
  sockaddr *extraout_RDX_36;
  sockaddr *extraout_RDX_37;
  sockaddr *extraout_RDX_38;
  sockaddr *extraout_RDX_39;
  sockaddr *extraout_RDX_40;
  sockaddr *extraout_RDX_41;
  sockaddr *extraout_RDX_42;
  sockaddr *extraout_RDX_43;
  sockaddr *extraout_RDX_44;
  sockaddr *extraout_RDX_45;
  sockaddr *extraout_RDX_46;
  sockaddr *extraout_RDX_47;
  sockaddr *extraout_RDX_48;
  QKeyEvent *in_RSI;
  QKeyEvent *pQVar18;
  QAction *pQVar19;
  QAction *pQVar20;
  QAction *pQVar21;
  long lVar22;
  QMenuPrivate *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar23 [16];
  QMenuBar *mb_2;
  int key_1;
  QAction *act_4;
  int i_4;
  QAction *firstAfterCurrent;
  QAction *currentSelected;
  QAction *first;
  int clashCount;
  int c;
  QAction *act_3;
  int match_count;
  int i_3;
  int best_match_count;
  QAction *nextAction_2;
  bool activateAction;
  QMenuBar *mb_1;
  QMenuBar *mb;
  int x_1;
  int x;
  QAction *nextAction_1;
  int bottomVisible;
  QAction *next_1;
  int next_i_1;
  int topVisible;
  QAction *next;
  int next_i;
  QAction *act_2;
  int y;
  int i_2;
  QAction *act_1;
  int i_1;
  QAction *act;
  int i;
  ScrollLocation scroll_loc;
  QAction *nextAction;
  bool key_consumed;
  int key;
  QMenuPrivate *d;
  QAction *oldAct;
  QKeySequence sequence;
  QChar c_1;
  QString act_text;
  KeyboardModifiers modifiers;
  QPointer<QWidget> caused_1;
  QPointer<QWidget> caused;
  QRect actionR_1;
  QRect actionR;
  int in_stack_fffffffffffffd18;
  CaseSensitivity in_stack_fffffffffffffd1c;
  QMenuPrivate *in_stack_fffffffffffffd20;
  QMenuPrivate *in_stack_fffffffffffffd28;
  QMenuPrivate *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  undefined1 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd41;
  byte bVar24;
  undefined1 uVar25;
  byte in_stack_fffffffffffffd42;
  byte in_stack_fffffffffffffd43;
  int in_stack_fffffffffffffd44;
  QMenuPrivate *in_stack_fffffffffffffd48;
  ScrollLocation location;
  undefined4 in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd54;
  uint in_stack_fffffffffffffd58;
  undefined1 self;
  undefined2 in_stack_fffffffffffffd5c;
  undefined1 in_stack_fffffffffffffd5e;
  undefined1 in_stack_fffffffffffffd5f;
  QMenuPrivate *in_stack_fffffffffffffd60;
  SelectionReason in_stack_fffffffffffffd68;
  uint in_stack_fffffffffffffd6c;
  int in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  bool page;
  undefined8 in_stack_fffffffffffffd88;
  ScrollDirection direction;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  QMenu *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffdb8;
  CaseSensitivity in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  QAction *local_230;
  QAction *local_228;
  QAction *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  undefined2 in_stack_fffffffffffffdf0;
  QChar in_stack_fffffffffffffdf2;
  int in_stack_fffffffffffffdf4;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  QAction *local_1f0;
  int local_1c8;
  int local_1c4;
  QAction *local_1c0;
  int local_1b4;
  Int local_1a8;
  int local_1a4;
  Int local_194;
  int local_188;
  Int local_184;
  int local_174;
  int local_168;
  int local_164;
  QAction *local_160;
  int local_154;
  QAction *local_138;
  QKeyCombination local_12c [7];
  undefined1 *local_110 [4];
  char16_t local_ec;
  QChar local_ea;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  QAction local_d0 [28];
  QFlagsStorage<Qt::KeyboardModifier> local_b4;
  QString local_b0;
  QFlagsStorage<Qt::KeyboardModifier> local_94;
  Int local_90;
  Int local_8c;
  Int local_88;
  QFlagsStorage<Qt::KeyboardModifier> local_84;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_58;
  undefined1 *local_50;
  QPoint local_48;
  QAction *local_40;
  undefined1 local_38 [16];
  QPoint local_28;
  QAction *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar18 = in_RSI;
  pQVar8 = d_func((QMenu *)0x64bba1);
  QMenuPrivate::updateActionRects
            ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  local_154 = QKeyEvent::key(in_RSI);
  bVar2 = QWidget::isRightToLeft((QWidget *)0x64bbd7);
  rhs.i = (Int)pQVar18;
  if (bVar2) {
    if (local_154 == 0x1000012) {
      local_154 = 0x1000014;
    }
    else if (local_154 == 0x1000014) {
      local_154 = 0x1000012;
    }
  }
  if (local_154 == 0x1000001) {
    local_154 = 0x1000015;
  }
  if (local_154 == 0x1000002) {
    local_154 = 0x1000013;
  }
  bVar2 = false;
  IVar1 = (Int)in_RDI;
  if (local_154 == 0x20) {
    pQVar10 = QWidget::style((QWidget *)
                             CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    rhs.i = 0xf;
    in_RCX = in_RDI;
    iVar7 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,0xf,0);
    psVar17 = extraout_RDX_34;
    if (iVar7 == 0) goto LAB_0064cdf0;
LAB_0064cc8e:
    if (pQVar8->currentAction == (QAction *)0x0) {
      QMenuPrivate::setFirstActionActive
                ((QMenuPrivate *)
                 CONCAT44(in_stack_fffffffffffffd44,
                          CONCAT13(in_stack_fffffffffffffd43,
                                   CONCAT12(in_stack_fffffffffffffd42,
                                            CONCAT11(in_stack_fffffffffffffd41,
                                                     in_stack_fffffffffffffd40)))));
      bVar2 = true;
      psVar17 = extraout_RDX_35;
    }
    else {
      QMenuPrivate::setSyncAction
                ((QMenuPrivate *)
                 CONCAT44(in_stack_fffffffffffffd44,
                          CONCAT13(in_stack_fffffffffffffd43,
                                   CONCAT12(in_stack_fffffffffffffd42,
                                            CONCAT11(in_stack_fffffffffffffd41,
                                                     in_stack_fffffffffffffd40)))));
      pQVar15 = QAction::menu<QMenu*>((QAction *)0x64ccdb);
      if (pQVar15 == (QMenu *)0x0) {
        rhs.i = (Int)pQVar8->currentAction;
        in_RCX = (QMenuPrivate *)0x1;
        QMenuPrivate::activateAction
                  ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   (QAction *)in_stack_fffffffffffffd60,
                   CONCAT13(in_stack_fffffffffffffd5f,
                            CONCAT12(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd5c)),
                   SUB41(in_stack_fffffffffffffd58 >> 0x18,0));
        psVar17 = extraout_RDX_37;
      }
      else {
        rhs.i = (Int)pQVar8->currentAction;
        in_RCX = (QMenuPrivate *)0x1;
        QMenuPrivate::popupAction
                  ((QMenuPrivate *)
                   CONCAT44(in_stack_fffffffffffffd44,
                            CONCAT13(in_stack_fffffffffffffd43,
                                     CONCAT12(in_stack_fffffffffffffd42,
                                              CONCAT11(in_stack_fffffffffffffd41,
                                                       in_stack_fffffffffffffd40)))),
                   (QAction *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                   (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffd30 >> 0x18,0));
        psVar17 = extraout_RDX_36;
      }
      bVar2 = true;
    }
  }
  else {
    if (local_154 + 0xfefffffcU < 2) goto LAB_0064cc8e;
    bVar4 = SUB81((ulong)in_stack_fffffffffffffd48 >> 0x18,0);
    location = (ScrollLocation)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    psVar17 = extraout_RDX;
    if (local_154 == 0x1000010) {
      bVar2 = true;
      if (pQVar8->scroll != (QMenuScroller *)0x0) {
        rhs.i = 2;
        QMenuPrivate::scrollMenu
                  ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   location,bVar4);
        psVar17 = extraout_RDX_00;
      }
    }
    else if (local_154 == 0x1000011) {
      bVar2 = true;
      if (pQVar8->scroll != (QMenuScroller *)0x0) {
        rhs.i = 1;
        QMenuPrivate::scrollMenu
                  ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   location,bVar4);
        psVar17 = extraout_RDX_01;
      }
    }
    else {
      if (local_154 != 0x1000012) {
        if (local_154 != 0x1000013) {
          if (local_154 == 0x1000014) {
            if (pQVar8->currentAction != (QAction *)0x0) {
              auVar23 = QAction::isEnabled();
              psVar17 = auVar23._8_8_;
              if (((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
                 (pQVar15 = QAction::menu<QMenu*>((QAction *)0x64c7e9), psVar17 = extraout_RDX_21,
                 pQVar15 != (QMenu *)0x0)) {
                rhs.i = (Int)pQVar8->currentAction;
                in_RCX = (QMenuPrivate *)0x1;
                QMenuPrivate::popupAction
                          ((QMenuPrivate *)
                           CONCAT44(in_stack_fffffffffffffd44,
                                    CONCAT13(in_stack_fffffffffffffd43,
                                             CONCAT12(in_stack_fffffffffffffd42,
                                                      CONCAT11(in_stack_fffffffffffffd41,
                                                               in_stack_fffffffffffffd40)))),
                           (QAction *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                           (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffffd30 >> 0x18,0));
                bVar2 = true;
                psVar17 = extraout_RDX_22;
                goto LAB_0064cdf0;
              }
            }
            goto LAB_0064c821;
          }
          if (local_154 != 0x1000015) {
            bVar3 = SUB81((ulong)in_stack_fffffffffffffd88 >> 0x10,0);
            page = SUB81((ulong)in_stack_fffffffffffffd88 >> 0x18,0);
            direction = (ScrollDirection)((ulong)in_stack_fffffffffffffd88 >> 0x20);
            if (local_154 == 0x1000016) {
              bVar2 = true;
              if ((pQVar8->currentAction != (QAction *)0x0) &&
                 (pQVar8->scroll != (QMenuScroller *)0x0)) {
                if ((pQVar8->scroll->scrollFlags & 1) == 0) {
                  rhs.i = 2;
                  QMenuPrivate::scrollMenu
                            ((QMenuPrivate *)
                             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),location,
                             bVar4);
                  psVar17 = extraout_RDX_03;
                }
                else {
                  in_RCX = (QMenuPrivate *)0x1;
                  rhs.i = 1;
                  QMenuPrivate::scrollMenu
                            ((QMenuPrivate *)
                             CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),direction
                             ,page,bVar3);
                  psVar17 = extraout_RDX_02;
                }
              }
            }
            else if (local_154 == 0x1000017) {
              bVar2 = true;
              if ((pQVar8->currentAction != (QAction *)0x0) &&
                 (pQVar8->scroll != (QMenuScroller *)0x0)) {
                if ((pQVar8->scroll->scrollFlags & 2) == 0) {
                  rhs.i = 1;
                  QMenuPrivate::scrollMenu
                            ((QMenuPrivate *)
                             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),location,
                             bVar4);
                  psVar17 = extraout_RDX_05;
                }
                else {
                  rhs.i = 2;
                  in_RCX = (QMenuPrivate *)0x1;
                  QMenuPrivate::scrollMenu
                            ((QMenuPrivate *)
                             CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),direction
                             ,page,bVar3);
                  psVar17 = extraout_RDX_04;
                }
              }
            }
            else if (local_154 == 0x1000023) {
              if ((*(ushort *)&pQVar8->field_0x420 >> 10 & 1) == 0) {
                bVar2 = true;
                pQVar10 = QWidget::style((QWidget *)
                                         CONCAT44(in_stack_fffffffffffffd1c,
                                                  in_stack_fffffffffffffd18));
                rhs.i = 0x12;
                in_RCX = in_RDI;
                iVar7 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,0x12,0);
                psVar17 = extraout_RDX_31;
                if (iVar7 != 0) {
                  rhs.i = IVar1;
                  QMenuPrivate::hideMenu
                            ((QMenuPrivate *)
                             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                             in_stack_fffffffffffffd98);
                  QApplication::focusWidget();
                  pQVar9 = qobject_cast<QMenuBar*>((QObject *)0x64cc23);
                  psVar17 = extraout_RDX_32;
                  if (pQVar9 != (QMenuBar *)0x0) {
                    QMenuBar::d_func((QMenuBar *)0x64cc43);
                    rhs.i = 0;
                    QMenuBarPrivate::setKeyboardMode
                              ((QMenuBarPrivate *)
                               CONCAT44(in_stack_fffffffffffffd44,
                                        CONCAT13(in_stack_fffffffffffffd43,
                                                 CONCAT12(in_stack_fffffffffffffd42,
                                                          CONCAT11(in_stack_fffffffffffffd41,
                                                                   in_stack_fffffffffffffd40)))),
                               (bool)in_stack_fffffffffffffd3f);
                    psVar17 = extraout_RDX_33;
                  }
                }
              }
            }
            else if (local_154 == 0x1000030) {
              in_RCX = (QMenuPrivate *)pQVar8->currentAction;
              in_stack_fffffffffffffd42 = 1;
              in_stack_fffffffffffffd43 = in_stack_fffffffffffffd42;
              if (in_RCX != (QMenuPrivate *)0x0) {
                rhs.i = (Int)pQVar8->currentAction;
                QAction::whatsThis();
                in_stack_fffffffffffffd42 = QString::isNull((QString *)0x64cd8a);
                in_stack_fffffffffffffd43 = in_stack_fffffffffffffd42;
                QString::~QString((QString *)0x64cdaf);
                psVar17 = extraout_RDX_38;
              }
              uVar25 = (undefined1)(in_stack_fffffffffffffd58 >> 0x18);
              if ((in_stack_fffffffffffffd42 & 1) == 0) {
                QWhatsThis::enterWhatsThisMode();
                QMenuPrivate::activateAction
                          ((QMenuPrivate *)
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                           (QAction *)in_stack_fffffffffffffd60,
                           CONCAT13(in_stack_fffffffffffffd5f,
                                    CONCAT12(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd5c)),
                           (bool)uVar25);
                goto LAB_0064d7ad;
              }
            }
            else {
              bVar2 = false;
            }
            goto LAB_0064cdf0;
          }
        }
        bVar2 = true;
        local_160 = (QAction *)0x0;
        local_164 = 0;
        pQVar21 = local_160;
        if (pQVar8->currentAction == (QAction *)0x0) {
          if (local_154 == 0x1000015) {
            local_168 = 0;
            while( true ) {
              rhs.i = (Int)pQVar18;
              in_stack_fffffffffffffd98 = (QMenu *)(long)local_168;
              in_RCX = (QMenuPrivate *)
                       QList<QAction_*>::size(&(pQVar8->super_QWidgetPrivate).actions);
              psVar17 = extraout_RDX_06;
              pQVar21 = local_160;
              if ((long)in_RCX <= (long)in_stack_fffffffffffffd98) break;
              pQVar18 = (QKeyEvent *)(long)local_168;
              QList<QRect>::at((QList<QRect> *)in_stack_fffffffffffffd20,
                               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
              bVar4 = QRect::isNull((QRect *)in_stack_fffffffffffffd20);
              if (!bVar4) {
                ppQVar12 = QList<QAction_*>::at
                                     ((QList<QAction_*> *)in_stack_fffffffffffffd20,
                                      CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18))
                ;
                pQVar21 = *ppQVar12;
                pQVar18 = (QKeyEvent *)pQVar21;
                bVar4 = QMenuPrivate::considerAction
                                  (in_stack_fffffffffffffd28,(QAction *)in_stack_fffffffffffffd20);
                rhs.i = (Int)pQVar18;
                psVar17 = extraout_RDX_07;
                if (bVar4) break;
              }
              local_168 = local_168 + 1;
            }
          }
          else {
            qVar11 = QList<QAction_*>::size(&(pQVar8->super_QWidgetPrivate).actions);
            local_174 = (int)qVar11;
            psVar17 = extraout_RDX_08;
            do {
              do {
                local_174 = local_174 + -1;
                rhs.i = (Int)pQVar18;
                pQVar21 = local_160;
                if (local_174 < 0) goto LAB_0064c727;
                pQVar18 = (QKeyEvent *)(long)local_174;
                QList<QRect>::at((QList<QRect> *)in_stack_fffffffffffffd20,
                                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
                bVar4 = QRect::isNull((QRect *)in_stack_fffffffffffffd20);
                psVar17 = extraout_RDX_09;
              } while (bVar4);
              ppQVar12 = QList<QAction_*>::at
                                   ((QList<QAction_*> *)in_stack_fffffffffffffd20,
                                    CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
              pQVar21 = *ppQVar12;
              pQVar18 = (QKeyEvent *)pQVar21;
              bVar4 = QMenuPrivate::considerAction
                                (in_stack_fffffffffffffd28,(QAction *)in_stack_fffffffffffffd20);
              rhs.i = (Int)pQVar18;
              psVar17 = extraout_RDX_10;
            } while (!bVar4);
          }
        }
        else {
          local_184 = 0;
          local_188 = 0;
          while( true ) {
            rhs.i = (Int)pQVar18;
            lVar22 = (long)(int)local_184;
            in_RCX = (QMenuPrivate *)QList<QAction_*>::size(&(pQVar8->super_QWidgetPrivate).actions)
            ;
            psVar17 = extraout_RDX_11;
            if ((long)in_RCX <= lVar22) break;
            ppQVar12 = QList<QAction_*>::at
                                 ((QList<QAction_*> *)in_stack_fffffffffffffd20,
                                  CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
            if (*ppQVar12 == pQVar8->currentAction) {
              if (local_154 == 0x1000013) goto LAB_0064c168;
              QList<QRect>::at((QList<QRect> *)in_stack_fffffffffffffd20,
                               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
              iVar7 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd1c,
                                                      in_stack_fffffffffffffd18));
              goto LAB_0064c435;
            }
            pQVar18 = (QKeyEvent *)(long)(int)local_184;
            QList<QRect>::at((QList<QRect> *)in_stack_fffffffffffffd20,
                             CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
            iVar7 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd1c,
                                                    in_stack_fffffffffffffd18));
            local_188 = iVar7 + local_188;
            local_184 = local_184 + 1;
          }
        }
        goto LAB_0064c727;
      }
LAB_0064c821:
      if ((pQVar8->currentAction != (QAction *)0x0) && (pQVar8->scroll == (QMenuScroller *)0x0)) {
        local_1c0 = (QAction *)0x0;
        if (local_154 == 0x1000012) {
          local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar21 = pQVar8->currentAction;
          local_18 = (undefined1  [16])
                     QMenuPrivate::actionRect
                               (in_stack_fffffffffffffd30,
                                (QAction *)
                                CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
          local_1c4 = QRect::left((QRect *)0x64c8c1);
          psVar17 = extraout_RDX_23;
          while( true ) {
            local_1c4 = local_1c4 + -1;
            rhs.i = (Int)pQVar21;
            uVar5 = in_stack_fffffffffffffd6c & 0xffffff;
            if (local_1c0 == (QAction *)0x0) {
              uVar5 = CONCAT13(-1 < local_1c4,(int3)in_stack_fffffffffffffd6c);
            }
            in_stack_fffffffffffffd6c = uVar5;
            if ((char)(in_stack_fffffffffffffd6c >> 0x18) == '\0') break;
            in_stack_fffffffffffffd5c = (undefined2)local_1c4;
            in_stack_fffffffffffffd5e = (undefined1)((uint)local_1c4 >> 0x10);
            in_stack_fffffffffffffd5f = (undefined1)((uint)local_1c4 >> 0x18);
            in_stack_fffffffffffffd60 = pQVar8;
            local_28 = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffd44,
                                                       CONCAT13(in_stack_fffffffffffffd43,
                                                                CONCAT12(in_stack_fffffffffffffd42,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffd41,
                                                  in_stack_fffffffffffffd40)))));
            QPoint::y((QPoint *)0x64c92f);
            QPoint::QPoint((QPoint *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c,
                           in_stack_fffffffffffffd18);
            p.yp.m_i._0_2_ = in_stack_fffffffffffffd5c;
            p.xp.m_i = in_stack_fffffffffffffd58;
            p.yp.m_i._2_1_ = in_stack_fffffffffffffd5e;
            p.yp.m_i._3_1_ = in_stack_fffffffffffffd5f;
            pQVar21 = local_20;
            local_1c0 = QMenuPrivate::actionAt
                                  ((QMenuPrivate *)
                                   CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),p);
            psVar17 = extraout_RDX_24;
          }
        }
        else {
          local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar21 = pQVar8->currentAction;
          local_38 = (undefined1  [16])
                     QMenuPrivate::actionRect
                               (in_stack_fffffffffffffd30,
                                (QAction *)
                                CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
          local_1c8 = QRect::right((QRect *)0x64c9ce);
          psVar17 = extraout_RDX_25;
          while( true ) {
            local_1c8 = local_1c8 + 1;
            rhs.i = (Int)pQVar21;
            in_stack_fffffffffffffd58 = in_stack_fffffffffffffd58 & 0xffffff;
            if (local_1c0 == (QAction *)0x0) {
              in_stack_fffffffffffffd54 = local_1c8;
              uVar5 = QWidget::width((QWidget *)0x64ca01);
              in_RCX = (QMenuPrivate *)(ulong)uVar5;
              in_stack_fffffffffffffd58 =
                   CONCAT13(in_stack_fffffffffffffd54 < (int)uVar5,(int3)in_stack_fffffffffffffd58);
              psVar17 = extraout_RDX_26;
            }
            if ((char)(in_stack_fffffffffffffd58 >> 0x18) == '\0') break;
            in_stack_fffffffffffffd44 = local_1c8;
            in_stack_fffffffffffffd48 = pQVar8;
            local_48 = QRect::center((QRect *)CONCAT44(local_1c8,
                                                       CONCAT13(in_stack_fffffffffffffd43,
                                                                CONCAT12(in_stack_fffffffffffffd42,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffd41,
                                                  in_stack_fffffffffffffd40)))));
            QPoint::y((QPoint *)0x64ca54);
            QPoint::QPoint((QPoint *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c,
                           in_stack_fffffffffffffd18);
            p_00.yp.m_i._0_2_ = in_stack_fffffffffffffd5c;
            p_00.xp.m_i = in_stack_fffffffffffffd58;
            p_00.yp.m_i._2_1_ = in_stack_fffffffffffffd5e;
            p_00.yp.m_i._3_1_ = in_stack_fffffffffffffd5f;
            pQVar21 = local_40;
            local_1c0 = QMenuPrivate::actionAt
                                  ((QMenuPrivate *)
                                   CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                                   p_00);
            psVar17 = extraout_RDX_27;
          }
        }
        bVar2 = local_1c0 != (QAction *)0x0;
        if (bVar2) {
          rhs.i = (Int)local_1c0;
          in_RCX = (QMenuPrivate *)0x0;
          QMenuPrivate::setCurrentAction
                    ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                     (QAction *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                     in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68,
                     SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0));
          psVar17 = extraout_RDX_28;
        }
      }
      if ((!bVar2) && (local_154 == 0x1000012)) {
        ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x64cb01);
        pQVar15 = qobject_cast<QMenu*>((QObject *)0x64cb09);
        psVar17 = extraout_RDX_29;
        if (pQVar15 != (QMenu *)0x0) {
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          local_50 = &DAT_aaaaaaaaaaaaaaaa;
          QPointer<QWidget>::QPointer
                    ((QPointer<QWidget> *)in_stack_fffffffffffffd20,
                     (QPointer<QWidget> *)
                     CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
          rhs.i = IVar1;
          QMenuPrivate::hideMenu
                    ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                     in_stack_fffffffffffffd98);
          bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x64cb6f);
          if (bVar2) {
            QPointer<QWidget>::operator->((QPointer<QWidget> *)0x64cb82);
            QWidget::setFocus((QWidget *)0x64cb8a);
          }
          bVar2 = true;
          QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x64cb9f);
          psVar17 = extraout_RDX_30;
        }
      }
    }
  }
  goto LAB_0064cdf0;
  while( true ) {
    pQVar19 = pQVar21;
    bVar4 = QMenuPrivate::considerAction
                      (in_stack_fffffffffffffd28,(QAction *)in_stack_fffffffffffffd20);
    rhs.i = (Int)pQVar19;
    if (bVar4) break;
LAB_0064c168:
    do {
      local_194 = local_184 - 1;
      if (local_194 == 0xffffffff) {
        pQVar10 = QWidget::style((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        rhs.i = 0x49;
        in_RCX = in_RDI;
        iVar7 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,0x49,0);
        psVar17 = extraout_RDX_12;
        if (iVar7 == 0) goto LAB_0064c3a5;
        if (pQVar8->scroll != (QMenuScroller *)0x0) {
          local_164 = 1;
        }
        qVar11 = QList<QRect>::size(&pQVar8->actionRects);
        local_194 = (int)qVar11 - 1;
      }
      rhs.i = local_194;
      ppQVar12 = QList<QAction_*>::at
                           ((QList<QAction_*> *)in_stack_fffffffffffffd20,
                            CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      pQVar21 = *ppQVar12;
      in_RCX = pQVar8;
      psVar17 = extraout_RDX_13;
      if (pQVar21 == pQVar8->currentAction) goto LAB_0064c3a5;
      QList<QRect>::at((QList<QRect> *)in_stack_fffffffffffffd20,
                       CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      bVar4 = QRect::isNull((QRect *)in_stack_fffffffffffffd20);
      local_184 = local_194;
    } while (bVar4);
  }
  psVar17 = extraout_RDX_14;
  local_160 = pQVar21;
  if ((pQVar8->scroll != (QMenuScroller *)0x0) && ((pQVar8->scroll->scrollFlags & 1) != 0)) {
    local_1a4 = QMenuPrivate::scrollerHeight(in_stack_fffffffffffffd20);
    if ((*(ushort *)&pQVar8->field_0x420 >> 9 & 1) != 0) {
      pQVar10 = QWidget::style((QWidget *)
                               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      iVar7 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x1f,0,in_RDI);
      local_1a4 = iVar7 + local_1a4;
    }
    iVar7 = pQVar8->scroll->scrollOffset;
    rhs.i = local_194;
    QList<QRect>::at((QList<QRect> *)in_stack_fffffffffffffd20,
                     CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    uVar5 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    in_RCX = (QMenuPrivate *)(ulong)uVar5;
    psVar17 = extraout_RDX_15;
    if ((local_188 + iVar7) - local_1a4 <= (int)uVar5) {
      local_164 = 2;
    }
  }
LAB_0064c3a5:
  pQVar21 = local_160;
  if ((local_160 == (QAction *)0x0) && ((*(ushort *)&pQVar8->field_0x420 >> 9 & 1) != 0)) {
    in_RCX = (QMenuPrivate *)
             (CONCAT62((int6)((ulong)in_RCX >> 0x10),*(undefined2 *)&pQVar8->field_0x420) &
              0xfffffffffffff7ff | 0x800);
    *(short *)&pQVar8->field_0x420 = (short)in_RCX;
  }
  goto LAB_0064c727;
  while( true ) {
    pQVar20 = pQVar19;
    bVar4 = QMenuPrivate::considerAction
                      (in_stack_fffffffffffffd28,(QAction *)in_stack_fffffffffffffd20);
    rhs.i = (Int)pQVar20;
    if (bVar4) break;
LAB_0064c435:
    do {
      local_1a8 = local_184 + 1;
      qVar11 = QList<QRect>::size(&pQVar8->actionRects);
      if ((int)local_1a8 == qVar11) {
        pQVar10 = QWidget::style((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        rhs.i = 0x49;
        in_RCX = in_RDI;
        iVar6 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,0x49,0);
        psVar17 = extraout_RDX_16;
        if (iVar6 == 0) goto LAB_0064c727;
        if (pQVar8->scroll != (QMenuScroller *)0x0) {
          local_164 = 2;
        }
        local_1a8 = 0;
      }
      rhs.i = local_1a8;
      ppQVar12 = QList<QAction_*>::at
                           ((QList<QAction_*> *)in_stack_fffffffffffffd20,
                            CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      pQVar19 = *ppQVar12;
      in_RCX = pQVar8;
      psVar17 = extraout_RDX_17;
      if (pQVar19 == pQVar8->currentAction) goto LAB_0064c727;
      QList<QRect>::at((QList<QRect> *)in_stack_fffffffffffffd20,
                       CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      bVar4 = QRect::isNull((QRect *)in_stack_fffffffffffffd20);
      local_184 = local_1a8;
    } while (bVar4);
  }
  psVar17 = extraout_RDX_18;
  pQVar21 = pQVar19;
  if ((pQVar8->scroll != (QMenuScroller *)0x0) && ((pQVar8->scroll->scrollFlags & 2) != 0)) {
    in_stack_fffffffffffffd74 = QWidget::height((QWidget *)0x64c5b2);
    local_1b4 = QMenuPrivate::scrollerHeight(in_stack_fffffffffffffd20);
    local_1b4 = in_stack_fffffffffffffd74 - local_1b4;
    if ((pQVar8->scroll->scrollFlags & 1) != 0) {
      iVar6 = QMenuPrivate::scrollerHeight(in_stack_fffffffffffffd20);
      local_1b4 = local_1b4 - iVar6;
    }
    if ((*(ushort *)&pQVar8->field_0x420 >> 9 & 1) != 0) {
      pQVar10 = QWidget::style((QWidget *)
                               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      iVar6 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x1f,0,in_RDI);
      local_1b4 = local_1b4 - iVar6;
    }
    in_stack_fffffffffffffd70 = iVar7 + local_188 + pQVar8->scroll->scrollOffset;
    rhs.i = local_1a8;
    QList<QRect>::at((QList<QRect> *)in_stack_fffffffffffffd20,
                     CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    uVar5 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    in_RCX = (QMenuPrivate *)(ulong)uVar5;
    psVar17 = extraout_RDX_19;
    if (local_1b4 < (int)(in_stack_fffffffffffffd70 + uVar5)) {
      local_164 = 1;
    }
  }
LAB_0064c727:
  local_160 = pQVar21;
  if (local_160 != (QAction *)0x0) {
    if ((pQVar8->scroll != (QMenuScroller *)0x0) && (local_164 != 0)) {
      QBasicTimer::stop();
      QMenuPrivate::scrollMenu
                ((QMenuPrivate *)
                 CONCAT44(in_stack_fffffffffffffdf4,
                          CONCAT22(in_stack_fffffffffffffdf2.ucs,in_stack_fffffffffffffdf0)),
                 (QAction *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                 (ScrollLocation)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffde0 >> 0x18,0));
    }
    rhs.i = (Int)local_160;
    in_RCX = (QMenuPrivate *)0x0;
    QMenuPrivate::setCurrentAction
              ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (QAction *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68,
               SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0));
    psVar17 = extraout_RDX_20;
  }
LAB_0064cdf0:
  if (!bVar2) {
    rhs.i = 0x46;
    auVar23 = QKeyEvent::matches((StandardKey)in_RSI);
    psVar17 = auVar23._8_8_;
    if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      bVar2 = true;
      if ((*(ushort *)&pQVar8->field_0x420 >> 10 & 1) != 0) {
        QWidget::close((QWidget *)in_RDI,rhs.i);
        goto LAB_0064d7ad;
      }
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      QPointer<QWidget>::QPointer
                ((QPointer<QWidget> *)in_stack_fffffffffffffd20,
                 (QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18))
      ;
      rhs.i = IVar1;
      QMenuPrivate::hideMenu
                ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 in_stack_fffffffffffffd98);
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x64ceac);
      pQVar9 = qobject_cast<QMenuBar*>((QObject *)0x64ceb4);
      if (pQVar9 != (QMenuBar *)0x0) {
        QMenuBar::d_func((QMenuBar *)0x64ced4);
        in_RCX = (QMenuPrivate *)0x0;
        QMenuBarPrivate::setCurrentAction
                  ((QMenuBarPrivate *)in_stack_fffffffffffffd60,
                   (QAction *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                   (bool)in_stack_fffffffffffffd5f,(bool)in_stack_fffffffffffffd5e);
        QMenuBar::d_func((QMenuBar *)0x64cefc);
        rhs.i = 1;
        QMenuBarPrivate::setKeyboardMode
                  ((QMenuBarPrivate *)
                   CONCAT44(in_stack_fffffffffffffd44,
                            CONCAT13(in_stack_fffffffffffffd43,
                                     CONCAT12(in_stack_fffffffffffffd42,
                                              CONCAT11(in_stack_fffffffffffffd41,
                                                       in_stack_fffffffffffffd40)))),
                   (bool)in_stack_fffffffffffffd3f);
      }
      QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x64cf16);
      psVar17 = extraout_RDX_39;
    }
  }
  if (!bVar2) {
    local_84.i = 0xaaaaaaaa;
    local_84.i = QKeyEvent::modifiers();
    bVar3 = QFlags<Qt::KeyboardModifier>::operator!((QFlags<Qt::KeyboardModifier> *)&local_84);
    bVar4 = false;
    if (bVar3) {
LAB_0064d015:
      rhs.i = (StandardKey)in_RSI;
      QKeyEvent::text((QKeyEvent *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      bVar4 = true;
      qVar11 = QString::size(&local_b0);
      bVar24 = qVar11 == 1;
      psVar17 = extraout_RDX_41;
    }
    else {
      local_88 = local_84.i;
      bVar3 = ::operator==((QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                           SUB84((ulong)in_stack_fffffffffffffd28 >> 0x20,0),
                           (KeyboardModifier)in_stack_fffffffffffffd20);
      if (bVar3) goto LAB_0064d015;
      local_8c = local_84.i;
      bVar3 = ::operator==((QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                           SUB84((ulong)in_stack_fffffffffffffd28 >> 0x20,0),
                           (KeyboardModifier)in_stack_fffffffffffffd20);
      if (bVar3) goto LAB_0064d015;
      local_90 = local_84.i;
      bVar3 = ::operator==((QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                           SUB84((ulong)in_stack_fffffffffffffd28 >> 0x20,0),
                           (KeyboardModifier)in_stack_fffffffffffffd20);
      if (bVar3) goto LAB_0064d015;
      local_94.i = local_84.i;
      rhs.i = (Int)Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                                 (enum_type)in_stack_fffffffffffffd20);
      bVar3 = ::operator==((QFlags<Qt::KeyboardModifier>)local_94.i,
                           (QFlags<Qt::KeyboardModifier>)rhs.i);
      in_RCX = (QMenuPrivate *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar3);
      bVar24 = false;
      psVar17 = extraout_RDX_40;
      if (bVar3) goto LAB_0064d015;
    }
    uVar25 = bVar24;
    if (bVar4) {
      QString::~QString((QString *)0x64d06b);
      psVar17 = extraout_RDX_42;
    }
    if ((bVar24 & 1) != 0) {
      bVar4 = false;
      local_1f0 = (QAction *)0x0;
      pQVar10 = QWidget::style((QWidget *)
                               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      iVar7 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,0x42,0,in_RDI);
      bVar3 = false;
      if (iVar7 != 0) {
        local_b4.i = QKeyEvent::modifiers();
        bVar3 = QFlags<Qt::KeyboardModifier>::operator!((QFlags<Qt::KeyboardModifier> *)&local_b4);
      }
      if (bVar3 == false) {
        in_stack_fffffffffffffdec = 0;
        in_stack_fffffffffffffde0 = (QAction *)0x0;
        local_228 = (QAction *)0x0;
        local_230 = (QAction *)0x0;
        local_ea.ucs = L'ꪪ';
        QKeyEvent::text((QKeyEvent *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        lVar22 = 0;
        local_ec = (char16_t)
                   QString::at((QString *)in_stack_fffffffffffffd28,
                               (qsizetype)in_stack_fffffffffffffd20);
        local_ea = QChar::toUpper((QChar *)in_stack_fffffffffffffd20);
        QString::~QString((QString *)0x64d3ce);
        iVar7 = 0;
        while( true ) {
          rhs.i = (Int)lVar22;
          in_stack_fffffffffffffd20 = (QMenuPrivate *)(long)iVar7;
          in_RCX = (QMenuPrivate *)QList<QAction_*>::size(&(pQVar8->super_QWidgetPrivate).actions);
          self = (undefined1)(in_stack_fffffffffffffd58 >> 0x18);
          if ((long)in_RCX <= (long)in_stack_fffffffffffffd20) break;
          lVar22 = (long)iVar7;
          QList<QRect>::at((QList<QRect> *)in_stack_fffffffffffffd20,
                           CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
          bVar4 = QRect::isNull((QRect *)in_stack_fffffffffffffd20);
          if (!bVar4) {
            lVar22 = (long)iVar7;
            ppQVar12 = QList<QAction_*>::at
                                 ((QList<QAction_*> *)in_stack_fffffffffffffd20,
                                  CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
            pQVar21 = *ppQVar12;
            uVar13 = QAction::isEnabled();
            if (((uVar13 & 1) != 0) && (uVar13 = QAction::isSeparator(), (uVar13 & 1) == 0)) {
              local_110[0] = &DAT_aaaaaaaaaaaaaaaa;
              QAction::text();
              QKeySequence::mnemonic((QString *)local_110);
              QString::~QString((QString *)0x64d4d2);
              lVar22 = 0;
              local_12c[0].combination = QKeySequence::operator[]((uint)local_110);
              in_stack_fffffffffffffd1c = QKeyCombination::toCombined(local_12c);
              in_stack_fffffffffffffd1c = in_stack_fffffffffffffd1c & 0xffff;
              in_stack_fffffffffffffdbc = in_stack_fffffffffffffd1c;
              pcVar14 = QChar::unicode(&local_ea);
              pQVar19 = local_228;
              if (in_stack_fffffffffffffd1c == (ushort)*pcVar14) {
                in_stack_fffffffffffffdec = in_stack_fffffffffffffdec + 1;
                if (in_stack_fffffffffffffde0 == (QAction *)0x0) {
                  in_stack_fffffffffffffde0 = pQVar21;
                }
                pQVar19 = pQVar21;
                if (((pQVar21 != pQVar8->currentAction) &&
                    (pQVar19 = local_228, local_230 == (QAction *)0x0)) &&
                   (local_228 != (QAction *)0x0)) {
                  local_230 = pQVar21;
                }
              }
              local_228 = pQVar19;
              QKeySequence::~QKeySequence((QKeySequence *)local_110);
            }
          }
          iVar7 = iVar7 + 1;
        }
        bVar4 = in_stack_fffffffffffffdec == 1;
        psVar17 = extraout_RDX_44;
        if ((((0 < in_stack_fffffffffffffdec) &&
             (local_1f0 = in_stack_fffffffffffffde0, in_stack_fffffffffffffdec != 1)) &&
            (local_228 != (QAction *)0x0)) && (local_230 != (QAction *)0x0)) {
          local_1f0 = local_230;
        }
      }
      else {
        local_1f4 = 0;
        QBasicTimer::start((QBasicTimer *)in_stack_fffffffffffffd30,
                           (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                           (QObject *)in_stack_fffffffffffffd28);
        QKeyEvent::text((QKeyEvent *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        pQVar21 = local_d0;
        QString::operator+=((QString *)in_stack_fffffffffffffd20,
                            (QString *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)
                           );
        QString::~QString((QString *)0x64d163);
        local_1f8 = 0;
        while( true ) {
          rhs.i = (Int)pQVar21;
          lVar22 = (long)local_1f8;
          in_RCX = (QMenuPrivate *)QList<QAction_*>::size(&(pQVar8->super_QWidgetPrivate).actions);
          self = (undefined1)(in_stack_fffffffffffffd58 >> 0x18);
          psVar17 = extraout_RDX_43;
          if ((long)in_RCX <= lVar22) break;
          local_1fc = 0;
          pQVar21 = (QAction *)(long)local_1f8;
          QList<QRect>::at((QList<QRect> *)in_stack_fffffffffffffd20,
                           CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
          bVar3 = QRect::isNull((QRect *)in_stack_fffffffffffffd20);
          if (!bVar3) {
            ppQVar12 = QList<QAction_*>::at
                                 ((QList<QAction_*> *)in_stack_fffffffffffffd20,
                                  CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
            pQVar19 = *ppQVar12;
            local_e8 = &DAT_aaaaaaaaaaaaaaaa;
            local_e0 = &DAT_aaaaaaaaaaaaaaaa;
            local_d8 = &DAT_aaaaaaaaaaaaaaaa;
            pQVar21 = pQVar19;
            QAction::text();
            in_stack_fffffffffffffdf4 = 0;
            while( true ) {
              this_00 = (QString *)(long)in_stack_fffffffffffffdf4;
              qVar11 = QString::size(&pQVar8->searchBuffer);
              if (qVar11 <= (long)this_00) break;
              in_stack_fffffffffffffdf2 = QString::at(this_00,(qsizetype)in_stack_fffffffffffffd20);
              pQVar21 = (QAction *)(ulong)(ushort)in_stack_fffffffffffffdf2.ucs;
              qVar11 = QString::indexOf(this_00,(QChar)(char16_t)
                                                       ((ulong)in_stack_fffffffffffffd48 >> 0x30),
                                        (qsizetype)in_stack_fffffffffffffd20,
                                        in_stack_fffffffffffffd1c);
              if (qVar11 != -1) {
                local_1fc = local_1fc + 1;
              }
              in_stack_fffffffffffffdf4 = in_stack_fffffffffffffdf4 + 1;
            }
            if (local_1f4 < local_1fc) {
              local_1f4 = local_1fc;
              local_1f0 = pQVar19;
            }
            QString::~QString((QString *)0x64d325);
          }
          local_1f8 = local_1f8 + 1;
        }
      }
      if (local_1f0 != (QAction *)0x0) {
        bVar2 = true;
        if (pQVar8->scroll != (QMenuScroller *)0x0) {
          QMenuPrivate::scrollMenu
                    ((QMenuPrivate *)
                     CONCAT44(in_stack_fffffffffffffdf4,
                              CONCAT22(in_stack_fffffffffffffdf2.ucs,in_stack_fffffffffffffdf0)),
                     (QAction *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                     (ScrollLocation)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffffde0 >> 0x18,0));
        }
        in_RCX = (QMenuPrivate *)0x1;
        rhs.i = (Int)local_1f0;
        QMenuPrivate::setCurrentAction
                  ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (QAction *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                   in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68,
                   SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0));
        pQVar15 = QAction::menu<QMenu*>((QAction *)0x64d6a3);
        psVar17 = extraout_RDX_45;
        if ((pQVar15 == (QMenu *)0x0) && (bVar4)) {
          QMenuPrivate::setSyncAction
                    ((QMenuPrivate *)
                     CONCAT44(in_stack_fffffffffffffd44,
                              CONCAT13(in_stack_fffffffffffffd43,
                                       CONCAT12(in_stack_fffffffffffffd42,CONCAT11(uVar25,bVar24))))
                    );
          in_RCX = (QMenuPrivate *)0x1;
          rhs.i = (Int)local_1f0;
          QMenuPrivate::activateAction
                    ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                     (QAction *)in_stack_fffffffffffffd60,
                     CONCAT13(in_stack_fffffffffffffd5f,
                              CONCAT12(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd5c)),
                     (bool)self);
          psVar17 = extraout_RDX_46;
        }
      }
    }
    if (!bVar2) {
      QMenuPrivate::topCausedWidget(in_stack_fffffffffffffd20);
      pQVar16 = (QObject *)qobject_cast<QMenuBar*>((QObject *)0x64d703);
      psVar17 = extraout_RDX_47;
      if (pQVar16 != (QObject *)0x0) {
        QMenuBar::d_func((QMenuBar *)0x64d723);
        local_138 = ::QPointer::operator_cast_to_QAction_((QPointer<QAction> *)0x64d732);
        QCoreApplication::sendEvent(pQVar16,(QEvent *)in_RSI);
        QMenuBar::d_func((QMenuBar *)0x64d75c);
        rhs.i = (Int)&local_138;
        bVar4 = ::operator!=((QPointer<QAction> *)in_stack_fffffffffffffd20,
                             (QAction **)
                             CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        psVar17 = extraout_RDX_48;
        if (bVar4) {
          bVar2 = true;
        }
      }
    }
  }
  if (bVar2) {
    QEvent::accept((QEvent *)in_RSI,rhs.i,psVar17,(socklen_t *)in_RCX);
  }
  else {
    QEvent::ignore((QEvent *)in_RSI);
  }
LAB_0064d7ad:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::keyPressEvent(QKeyEvent *e)
{
    Q_D(QMenu);
    d->updateActionRects();
    int key = e->key();
    if (isRightToLeft()) {  // in reverse mode open/close key for submenues are reversed
        if (key == Qt::Key_Left)
            key = Qt::Key_Right;
        else if (key == Qt::Key_Right)
            key = Qt::Key_Left;
    }
#ifndef Q_OS_MAC
    if (key == Qt::Key_Tab) //means down
        key = Qt::Key_Down;
    if (key == Qt::Key_Backtab) //means up
        key = Qt::Key_Up;
#endif

    bool key_consumed = false;
    switch(key) {
    case Qt::Key_Home:
        key_consumed = true;
        if (d->scroll)
            d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollTop, true);
        break;
    case Qt::Key_End:
        key_consumed = true;
        if (d->scroll)
            d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollBottom, true);
        break;
    case Qt::Key_PageUp:
        key_consumed = true;
        if (d->currentAction && d->scroll) {
            if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
                d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollUp, true, true);
            else
                d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollTop, true);
        }
        break;
    case Qt::Key_PageDown:
        key_consumed = true;
        if (d->currentAction && d->scroll) {
            if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollDown)
                d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollDown, true, true);
            else
                d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollBottom, true);
        }
        break;
    case Qt::Key_Up:
    case Qt::Key_Down: {
        key_consumed = true;
        QAction *nextAction = nullptr;
        QMenuPrivate::QMenuScroller::ScrollLocation scroll_loc = QMenuPrivate::QMenuScroller::ScrollStay;
        if (!d->currentAction) {
            if (key == Qt::Key_Down) {
                for(int i = 0; i < d->actions.size(); ++i) {
                    if (d->actionRects.at(i).isNull())
                        continue;
                    QAction *act = d->actions.at(i);
                    if (d->considerAction(act)) {
                        nextAction = act;
                        break;
                    }
                }
            } else {
                for(int i = d->actions.size()-1; i >= 0; --i) {
                    if (d->actionRects.at(i).isNull())
                        continue;
                    QAction *act = d->actions.at(i);
                    if (d->considerAction(act)) {
                        nextAction = act;
                        break;
                    }
                }
            }
        } else {
            for(int i = 0, y = 0; !nextAction && i < d->actions.size(); i++) {
                QAction *act = d->actions.at(i);
                if (act == d->currentAction) {
                    if (key == Qt::Key_Up) {
                        for(int next_i = i-1; true; next_i--) {
                            if (next_i == -1) {
                                if (!style()->styleHint(QStyle::SH_Menu_SelectionWrap, nullptr, this))
                                    break;
                                if (d->scroll)
                                    scroll_loc = QMenuPrivate::QMenuScroller::ScrollBottom;
                                next_i = d->actionRects.size()-1;
                            }
                            QAction *next = d->actions.at(next_i);
                            if (next == d->currentAction)
                                break;
                            if (d->actionRects.at(next_i).isNull())
                                continue;
                            if (!d->considerAction(next))
                                continue;
                            nextAction = next;
                            if (d->scroll && (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)) {
                                int topVisible = d->scrollerHeight();
                                if (d->tearoff)
                                    topVisible += style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, this);
                                if (((y + d->scroll->scrollOffset) - topVisible) <= d->actionRects.at(next_i).height())
                                    scroll_loc = QMenuPrivate::QMenuScroller::ScrollTop;
                            }
                            break;
                        }
                        if (!nextAction && d->tearoff)
                            d->tearoffHighlighted = 1;
                    } else {
                        y += d->actionRects.at(i).height();
                        for(int next_i = i+1; true; next_i++) {
                            if (next_i == d->actionRects.size()) {
                                if (!style()->styleHint(QStyle::SH_Menu_SelectionWrap, nullptr, this))
                                    break;
                                if (d->scroll)
                                    scroll_loc = QMenuPrivate::QMenuScroller::ScrollTop;
                                next_i = 0;
                            }
                            QAction *next = d->actions.at(next_i);
                            if (next == d->currentAction)
                                break;
                            if (d->actionRects.at(next_i).isNull())
                                continue;
                            if (!d->considerAction(next))
                                continue;
                            nextAction = next;
                            if (d->scroll && (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollDown)) {
                                int bottomVisible = height() - d->scrollerHeight();
                                if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
                                    bottomVisible -= d->scrollerHeight();
                                if (d->tearoff)
                                    bottomVisible -= style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, this);
                                if ((y + d->scroll->scrollOffset + d->actionRects.at(next_i).height()) > bottomVisible)
                                    scroll_loc = QMenuPrivate::QMenuScroller::ScrollBottom;
                            }
                            break;
                        }
                    }
                    break;
                }
                y += d->actionRects.at(i).height();
            }
        }
        if (nextAction) {
            if (d->scroll && scroll_loc != QMenuPrivate::QMenuScroller::ScrollStay) {
                d->scroll->scrollTimer.stop();
                d->scrollMenu(nextAction, scroll_loc);
            }
            d->setCurrentAction(nextAction, /*popup*/-1, QMenuPrivate::SelectedFromKeyboard);
        }
        break; }

    case Qt::Key_Right:
        if (d->currentAction && d->currentAction->isEnabled() && d->currentAction->menu()) {
            d->popupAction(d->currentAction, 0, true);
            key_consumed = true;
            break;
        }
        Q_FALLTHROUGH();
    case Qt::Key_Left: {
        if (d->currentAction && !d->scroll) {
            QAction *nextAction = nullptr;
            if (key == Qt::Key_Left) {
                QRect actionR = d->actionRect(d->currentAction);
                for(int x = actionR.left()-1; !nextAction && x >= 0; x--)
                    nextAction = d->actionAt(QPoint(x, actionR.center().y()));
            } else {
                QRect actionR = d->actionRect(d->currentAction);
                for(int x = actionR.right()+1; !nextAction && x < width(); x++)
                    nextAction = d->actionAt(QPoint(x, actionR.center().y()));
            }
            if (nextAction) {
                d->setCurrentAction(nextAction, /*popup*/-1, QMenuPrivate::SelectedFromKeyboard);
                key_consumed = true;
            }
        }
        if (!key_consumed && key == Qt::Key_Left && qobject_cast<QMenu*>(d->causedPopup.widget)) {
            QPointer<QWidget> caused = d->causedPopup.widget;
            d->hideMenu(this);
            if (caused)
                caused->setFocus();
            key_consumed = true;
        }
        break; }

    case Qt::Key_Alt:
        if (d->tornoff)
            break;

        key_consumed = true;
        if (style()->styleHint(QStyle::SH_MenuBar_AltKeyNavigation, nullptr, this))
        {
            d->hideMenu(this);
#if QT_CONFIG(menubar)
            if (QMenuBar *mb = qobject_cast<QMenuBar*>(QApplication::focusWidget())) {
                mb->d_func()->setKeyboardMode(false);
            }
#endif
        }
        break;

    case Qt::Key_Space:
        if (!style()->styleHint(QStyle::SH_Menu_SpaceActivatesItem, nullptr, this))
            break;
        // for motif, fall through
        Q_FALLTHROUGH();
#ifdef QT_KEYPAD_NAVIGATION
    case Qt::Key_Select:
#endif
    case Qt::Key_Return:
    case Qt::Key_Enter: {
        if (!d->currentAction) {
            d->setFirstActionActive();
            key_consumed = true;
            break;
        }

        d->setSyncAction();

        if (d->currentAction->menu())
            d->popupAction(d->currentAction, 0, true);
        else
            d->activateAction(d->currentAction, QAction::Trigger);
        key_consumed = true;
        break; }

#if QT_CONFIG(whatsthis)
    case Qt::Key_F1:
        if (!d->currentAction || d->currentAction->whatsThis().isNull())
            break;
        QWhatsThis::enterWhatsThisMode();
        d->activateAction(d->currentAction, QAction::Trigger);
        return;
#endif
    default:
        key_consumed = false;
    }

    if (!key_consumed && (
        false
#ifndef QT_NO_SHORTCUT
        || e->matches(QKeySequence::Cancel)
#endif
#ifdef QT_KEYPAD_NAVIGATION
        || e->key() == Qt::Key_Back
#endif
    )) {
        key_consumed = true;
        if (d->tornoff) {
            close();
            return;
        }
        {
            QPointer<QWidget> caused = d->causedPopup.widget;
            d->hideMenu(this); // hide after getting causedPopup
#if QT_CONFIG(menubar)
            if (QMenuBar *mb = qobject_cast<QMenuBar*>(caused)) {
                mb->d_func()->setCurrentAction(d->menuAction);
                mb->d_func()->setKeyboardMode(true);
            }
#endif
        }
    }

    if (!key_consumed) {                                // send to menu bar
        const Qt::KeyboardModifiers modifiers = e->modifiers();
        if ((!modifiers || modifiers == Qt::AltModifier || modifiers == Qt::ShiftModifier
             || modifiers == Qt::KeypadModifier
             || modifiers == (Qt::KeypadModifier | Qt::AltModifier))
            && e->text().size() == 1) {
            bool activateAction = false;
            QAction *nextAction = nullptr;
            if (style()->styleHint(QStyle::SH_Menu_KeyboardSearch, nullptr, this) && !e->modifiers()) {
                int best_match_count = 0;
                d->searchBufferTimer.start(2000, this);
                d->searchBuffer += e->text();
                for(int i = 0; i < d->actions.size(); ++i) {
                    int match_count = 0;
                    if (d->actionRects.at(i).isNull())
                        continue;
                    QAction *act = d->actions.at(i);
                    const QString act_text = act->text();
                    for(int c = 0; c < d->searchBuffer.size(); ++c) {
                        if (act_text.indexOf(d->searchBuffer.at(c), 0, Qt::CaseInsensitive) != -1)
                            ++match_count;
                    }
                    if (match_count > best_match_count) {
                        best_match_count = match_count;
                        nextAction = act;
                    }
                }
            }
#ifndef QT_NO_SHORTCUT
            else {
                int clashCount = 0;
                QAction *first = nullptr, *currentSelected = nullptr, *firstAfterCurrent = nullptr;
                QChar c = e->text().at(0).toUpper();
                for(int i = 0; i < d->actions.size(); ++i) {
                    if (d->actionRects.at(i).isNull())
                        continue;
                    QAction *act = d->actions.at(i);
                    if (!act->isEnabled() || act->isSeparator())
                        continue;
                    QKeySequence sequence = QKeySequence::mnemonic(act->text());
                    int key = sequence[0].toCombined() & 0xffff; // suspicious
                    if (key == c.unicode()) {
                        clashCount++;
                        if (!first)
                            first = act;
                        if (act == d->currentAction)
                            currentSelected = act;
                        else if (!firstAfterCurrent && currentSelected)
                            firstAfterCurrent = act;
                    }
                }
                if (clashCount == 1)
                    activateAction = true;
                if (clashCount >= 1) {
                    if (clashCount == 1 || !currentSelected || !firstAfterCurrent)
                        nextAction = first;
                    else
                        nextAction = firstAfterCurrent;
                }
            }
#endif
            if (nextAction) {
                key_consumed = true;
                if (d->scroll)
                    d->scrollMenu(nextAction, QMenuPrivate::QMenuScroller::ScrollCenter, false);
                d->setCurrentAction(nextAction, 0, QMenuPrivate::SelectedFromElsewhere, true);
                if (!nextAction->menu() && activateAction) {
                    d->setSyncAction();
                    d->activateAction(nextAction, QAction::Trigger);
                }
            }
        }
        if (!key_consumed) {
#if QT_CONFIG(menubar)
            if (QMenuBar *mb = qobject_cast<QMenuBar*>(d->topCausedWidget())) {
                QAction *oldAct = mb->d_func()->currentAction;
                QCoreApplication::sendEvent(mb, e);
                if (mb->d_func()->currentAction != oldAct)
                    key_consumed = true;
            }
#endif
        }

#ifdef Q_OS_WIN32
        if (key_consumed && (e->key() == Qt::Key_Control || e->key() == Qt::Key_Shift || e->key() == Qt::Key_Meta))
            QApplication::beep();
#endif // Q_OS_WIN32
    }
    if (key_consumed)
        e->accept();
    else
        e->ignore();
}